

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_busyindicator.cpp
# Opt level: O0

int __thiscall QtMWidgets::BusyIndicator::qt_metacall(BusyIndicator *this,Call _c,int _id,void **_a)

{
  QMetaType local_30;
  void **local_28;
  void **_a_local;
  int _id_local;
  Call _c_local;
  BusyIndicator *this_local;
  
  local_28 = _a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = this;
  _a_local._0_4_ = QWidget::qt_metacall((Call)this,_c,(void **)(ulong)(uint)_id);
  this_local._4_4_ = (int)_a_local;
  if (-1 < (int)_a_local) {
    if (_a_local._4_4_ == InvokeMetaMethod) {
      if ((int)_a_local < 1) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,(int)_a_local,local_28);
      }
      _a_local._0_4_ = (int)_a_local + -1;
    }
    else if (_a_local._4_4_ == RegisterMethodArgumentMetaType) {
      if ((int)_a_local < 1) {
        memset(&local_30,0,8);
        QMetaType::QMetaType(&local_30);
        *(QMetaTypeInterface **)*local_28 = local_30.d_ptr;
      }
      _a_local._0_4_ = (int)_a_local + -1;
    }
    else if ((((_a_local._4_4_ == ReadProperty) || (_a_local._4_4_ == WriteProperty)) ||
             (_a_local._4_4_ == ResetProperty)) ||
            ((_a_local._4_4_ == BindableProperty || (_a_local._4_4_ == RegisterPropertyMetaType))))
    {
      qt_static_metacall((QObject *)this,_a_local._4_4_,(int)_a_local,local_28);
      _a_local._0_4_ = (int)_a_local + -3;
    }
    this_local._4_4_ = (int)_a_local;
  }
  return this_local._4_4_;
}

Assistant:

int QtMWidgets::BusyIndicator::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}